

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  iterator iVar3;
  ostream *poVar4;
  PolicyID id;
  bool system;
  string local_200;
  string mfile;
  string module;
  string var;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&module,"Find",(allocator<char> *)&var);
  std::__cxx11::string::append((string *)&module);
  std::__cxx11::string::append((char *)&module);
  system = false;
  cmMakefile::GetModulesFile
            (&mfile,(this->super_cmFindCommon).super_cmCommand.Makefile,&module,&system);
  bVar1 = true;
  if (mfile._M_string_length != 0) {
    if (system == true) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::find(&(this->DeprecatedFindModules)._M_t,&this->Name);
      if ((_Rb_tree_header *)iVar3._M_node !=
          &(this->DeprecatedFindModules)._M_t._M_impl.super__Rb_tree_header) {
        PVar2 = cmMakefile::GetPolicyStatus
                          ((this->super_cmFindCommon).super_cmCommand.Makefile,
                           iVar3._M_node[2]._M_color,false);
        if (PVar2 - NEW < 3) goto LAB_001875cf;
        if (PVar2 == WARN) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&var);
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    (&local_200,(cmPolicies *)(ulong)iVar3._M_node[2]._M_color,id);
          poVar4 = std::operator<<((ostream *)&var,(string *)&local_200);
          std::operator<<(poVar4,"\n");
          std::__cxx11::string::~string((string *)&local_200);
          this_00 = (this->super_cmFindCommon).super_cmCommand.Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&var);
        }
      }
    }
    *found = true;
    std::__cxx11::string::string((string *)&var,(string *)&this->Name);
    std::__cxx11::string::append((char *)&var);
    cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&var,"1");
    bVar1 = ReadListFile(this,&mfile,DoPolicyScope);
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&var);
    std::__cxx11::string::~string((string *)&var);
  }
LAB_001875cf:
  std::__cxx11::string::~string((string *)&mfile);
  std::__cxx11::string::~string((string *)&module);
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string module = "Find";
  module += this->Name;
  module += ".cmake";
  bool system = false;
  std::string mfile = this->Makefile->GetModulesFile(module, system);
  if (!mfile.empty()) {
    if (system) {
      auto it = this->DeprecatedFindModules.find(this->Name);
      if (it != this->DeprecatedFindModules.end()) {
        cmPolicies::PolicyStatus status =
          this->Makefile->GetPolicyStatus(it->second);
        switch (status) {
          case cmPolicies::WARN: {
            std::ostringstream e;
            e << cmPolicies::GetPolicyWarning(it->second) << "\n";
            this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            return true;
        }
      }
    }

    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string var = this->Name;
    var += "_FIND_MODULE";
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile, DoPolicyScope);
    this->Makefile->RemoveDefinition(var);
    return result;
  }
  return true;
}